

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O3

uint8_t unicode_utf8_to_byte(string *utf8)

{
  int iVar1;
  iterator iVar2;
  
  if (unicode_utf8_to_byte(std::__cxx11::string_const&)::map_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&unicode_utf8_to_byte(std::__cxx11::string_const&)::map_abi_cxx11_);
    if (iVar1 != 0) {
      unicode_utf8_to_byte_map_abi_cxx11_();
      __cxa_atexit(std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
                   ::~unordered_map,
                   &unicode_utf8_to_byte(std::__cxx11::string_const&)::map_abi_cxx11_,&__dso_handle)
      ;
      __cxa_guard_release(&unicode_utf8_to_byte(std::__cxx11::string_const&)::map_abi_cxx11_);
    }
  }
  iVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&unicode_utf8_to_byte(std::__cxx11::string_const&)::map_abi_cxx11_._M_h,utf8);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_true>
      ._M_cur != (__node_type *)0x0) {
    return *(uint8_t *)
            ((long)iVar2.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_true>
                   ._M_cur + 0x28);
  }
  std::__throw_out_of_range("_Map_base::at");
}

Assistant:

uint8_t unicode_utf8_to_byte(const std::string & utf8) {
    static std::unordered_map<std::string, uint8_t> map = unicode_utf8_to_byte_map();
    return map.at(utf8);
}